

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

axbStatus_t check_equal_scalar(axbScalar_s *alpha,double a,char *test_desc)

{
  axbStatus_t aVar1;
  double dVar2;
  double dVar3;
  double t;
  double local_30;
  double local_28;
  
  local_28 = a;
  aVar1 = axbScalarGetValue(alpha,&local_30,AXB_REAL_DOUBLE);
  if (aVar1 == 0) {
    dVar2 = local_30 - local_28;
    if (dVar2 != 0.0) {
      dVar3 = ABS(local_30);
      if (ABS(local_30) <= ABS(local_28)) {
        dVar3 = ABS(local_28);
      }
      dVar2 = dVar2 / dVar3;
    }
    if (1e-13 < dVar2) {
      fprintf(_stderr,
              "ERROR: Test %s failed with relative error %g: reference %g vs. libaxb %g\n Aborting...\n"
              ,test_desc);
      exit(1);
    }
    printf("PASSED: Test %s\n",test_desc);
  }
  else {
    check_equal_scalar_cold_1();
  }
  return aVar1;
}

Assistant:

axbStatus_t check_equal_scalar(const struct axbScalar_s *alpha, double a, const char *test_desc)
{
  double t;
  AXB_ERR_CHECK(axbScalarGetValue(alpha, &t, AXB_REAL_DOUBLE));

  double rel_diff = get_rel_diff(t, a);
  if (rel_diff > TEST_EPSILON) {
    fprintf(stderr, "ERROR: Test %s failed with relative error %g: reference %g vs. libaxb %g\n Aborting...\n", test_desc, rel_diff, a, t);
    exit(EXIT_FAILURE);
  }

  printf("PASSED: Test %s\n", test_desc);
  return 0;
}